

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

string * __thiscall
google::protobuf::compiler::js::(anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,GeneratorOptions *options,
          Descriptor *desc)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  string *extraout_RAX;
  string *extraout_RAX_00;
  string *psVar4;
  size_type *psVar5;
  long *plVar6;
  ulong uVar7;
  string local_30;
  
  uVar3 = (ulong)*(int *)(desc + 0x2c);
  if (0 < (long)uVar3) {
    if (*(long *)(*(long *)(desc + 0x30) + 0x60) == 0) {
      plVar6 = (long *)(*(long *)(desc + 0x30) + 0x108);
      uVar2 = 1;
      do {
        uVar7 = uVar2;
        if (uVar3 == uVar7) break;
        lVar1 = *plVar6;
        plVar6 = plVar6 + 0x15;
        uVar2 = uVar7 + 1;
      } while (lVar1 == 0);
      if (uVar3 <= uVar7) goto LAB_00221271;
    }
    GetMessagePath_abi_cxx11_(&local_30,this,options,desc);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_30);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar5 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar5) {
      lVar1 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar5;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    psVar4 = (string *)&local_30.field_2;
    if ((string *)local_30._M_dataplus._M_p != psVar4) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      psVar4 = extraout_RAX_00;
    }
    return psVar4;
  }
LAB_00221271:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"null","");
  return extraout_RAX;
}

Assistant:

string OneofFieldsArrayName(const GeneratorOptions& options,
                            const Descriptor* desc) {
  return HasOneofFields(desc)
             ? (GetMessagePath(options, desc) + kOneofGroupArrayName)
             : "null";
}